

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O0

void BoxTranslate(box *Src,box *Dest,interval *distance,interval *angle,int dir)

{
  interval *piVar1;
  box local_130;
  interval local_120;
  interval local_108;
  box local_f0;
  interval local_e0;
  interval local_c8;
  interval local_b0;
  undefined1 local_98 [8];
  interval yvect;
  interval local_70;
  undefined1 local_58 [8];
  interval xvect;
  box P;
  int dir_local;
  interval *angle_local;
  interval *distance_local;
  box *Dest_local;
  box *Src_local;
  
  box::box((box *)&xvect.isEmpty,2);
  Cos(&local_70,angle);
  operator*((interval *)local_58,distance,&local_70);
  Sin(&local_b0,angle);
  operator*((interval *)local_98,distance,&local_b0);
  if (dir == 1) {
    piVar1 = box::operator[](Src,1);
    operator+(&local_c8,piVar1,(interval *)local_58);
    piVar1 = box::operator[]((box *)&xvect.isEmpty,1);
    interval::operator=(piVar1,&local_c8);
    piVar1 = box::operator[](Src,2);
    operator+(&local_e0,piVar1,(interval *)local_98);
    piVar1 = box::operator[]((box *)&xvect.isEmpty,2);
    interval::operator=(piVar1,&local_e0);
    Inter(&local_f0,Dest);
    box::operator=(Dest,&local_f0);
    box::~box(&local_f0);
  }
  else {
    piVar1 = box::operator[](Dest,1);
    operator-(&local_108,piVar1,(interval *)local_58);
    piVar1 = box::operator[]((box *)&xvect.isEmpty,1);
    interval::operator=(piVar1,&local_108);
    piVar1 = box::operator[](Dest,2);
    operator-(&local_120,piVar1,(interval *)local_98);
    piVar1 = box::operator[]((box *)&xvect.isEmpty,2);
    interval::operator=(piVar1,&local_120);
    Inter(&local_130,Src);
    box::operator=(Src,&local_130);
    box::~box(&local_130);
  }
  box::~box((box *)&xvect.isEmpty);
  return;
}

Assistant:

inline void BoxTranslate(box &Src, box &Dest, interval distance, interval angle, int dir)
{
	box P = box(2);
	interval xvect = distance*Cos(angle);
	interval yvect = distance*Sin(angle);

	if (dir == 1) 
	{
		P[1] = Src[1]+xvect;
		P[2] = Src[2]+yvect;
		Dest = Inter(Dest,P);
	}
	else
	{
		P[1] = Dest[1]-xvect;
		P[2] = Dest[2]-yvect;
		Src = Inter(Src,P);
	}
}